

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dyndep_parser.cc
# Opt level: O0

bool __thiscall DyndepParser::Parse(DyndepParser *this,string *filename,string *input,string *err)

{
  bool bVar1;
  char *pcVar2;
  Lexer *this_00;
  allocator<char> local_161;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_160;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_140;
  allocator<char> local_119;
  string local_118;
  string local_f8;
  allocator<char> local_d1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  allocator<char> local_79;
  string local_78;
  Token local_58;
  byte local_51;
  Token token;
  bool haveDyndepVersion;
  StringPiece local_40;
  string *local_30;
  string *err_local;
  string *input_local;
  string *filename_local;
  DyndepParser *this_local;
  
  local_30 = err;
  err_local = input;
  input_local = filename;
  filename_local = (string *)this;
  StringPiece::StringPiece(&local_40,filename);
  StringPiece::StringPiece((StringPiece *)&token,err_local);
  Lexer::Start(&(this->super_Parser).lexer_,local_40,_token);
  local_51 = 0;
  do {
    local_58 = Lexer::ReadToken(&(this->super_Parser).lexer_);
    switch(local_58) {
    case ERROR:
      this_00 = &(this->super_Parser).lexer_;
      Lexer::DescribeLastError_abi_cxx11_(&local_f8,this_00);
      this_local._7_1_ = Lexer::Error(this_00,&local_f8,local_30);
      std::__cxx11::string::~string((string *)&local_f8);
      goto LAB_00123547;
    case BUILD:
      if ((local_51 & 1) == 0) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_78,"expected \'ninja_dyndep_version = ...\'",&local_79);
        this_local._7_1_ = Lexer::Error(&(this->super_Parser).lexer_,&local_78,local_30);
        std::__cxx11::string::~string((string *)&local_78);
        std::allocator<char>::~allocator(&local_79);
        goto LAB_00123547;
      }
      bVar1 = ParseEdge(this,local_30);
      if (!bVar1) {
        this_local._7_1_ = 0;
LAB_00123547:
        return (bool)(this_local._7_1_ & 1);
      }
      break;
    default:
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_160,"unexpected ",&local_161);
      pcVar2 = Lexer::TokenName(local_58);
      std::operator+(&local_140,&local_160,pcVar2);
      this_local._7_1_ = Lexer::Error(&(this->super_Parser).lexer_,&local_140,local_30);
      std::__cxx11::string::~string((string *)&local_140);
      std::__cxx11::string::~string((string *)&local_160);
      std::allocator<char>::~allocator(&local_161);
      goto LAB_00123547;
    case IDENT:
      Lexer::UnreadToken(&(this->super_Parser).lexer_);
      if ((local_51 & 1) != 0) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_d0,"unexpected ",&local_d1);
        pcVar2 = Lexer::TokenName(local_58);
        std::operator+(&local_b0,&local_d0,pcVar2);
        this_local._7_1_ = Lexer::Error(&(this->super_Parser).lexer_,&local_b0,local_30);
        std::__cxx11::string::~string((string *)&local_b0);
        std::__cxx11::string::~string((string *)&local_d0);
        std::allocator<char>::~allocator(&local_d1);
        goto LAB_00123547;
      }
      bVar1 = ParseDyndepVersion(this,local_30);
      if (!bVar1) {
        this_local._7_1_ = 0;
        goto LAB_00123547;
      }
      local_51 = 1;
      break;
    case NEWLINE:
      break;
    case TEOF:
      if ((local_51 & 1) == 0) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_118,"expected \'ninja_dyndep_version = ...\'",&local_119);
        this_local._7_1_ = Lexer::Error(&(this->super_Parser).lexer_,&local_118,local_30);
        std::__cxx11::string::~string((string *)&local_118);
        std::allocator<char>::~allocator(&local_119);
      }
      else {
        this_local._7_1_ = 1;
      }
      goto LAB_00123547;
    }
  } while( true );
}

Assistant:

bool DyndepParser::Parse(const string& filename, const string& input,
                         string* err) {
  lexer_.Start(filename, input);

  // Require a supported ninja_dyndep_version value immediately so
  // we can exit before encountering any syntactic surprises.
  bool haveDyndepVersion = false;

  for (;;) {
    Lexer::Token token = lexer_.ReadToken();
    switch (token) {
    case Lexer::BUILD: {
      if (!haveDyndepVersion)
        return lexer_.Error("expected 'ninja_dyndep_version = ...'", err);
      if (!ParseEdge(err))
        return false;
      break;
    }
    case Lexer::IDENT: {
      lexer_.UnreadToken();
      if (haveDyndepVersion)
        return lexer_.Error(string("unexpected ") + Lexer::TokenName(token),
                            err);
      if (!ParseDyndepVersion(err))
        return false;
      haveDyndepVersion = true;
      break;
    }
    case Lexer::ERROR:
      return lexer_.Error(lexer_.DescribeLastError(), err);
    case Lexer::TEOF:
      if (!haveDyndepVersion)
        return lexer_.Error("expected 'ninja_dyndep_version = ...'", err);
      return true;
    case Lexer::NEWLINE:
      break;
    default:
      return lexer_.Error(string("unexpected ") + Lexer::TokenName(token),
                          err);
    }
  }
  return false;  // not reached
}